

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VProd(N_Vector X,N_Vector Y,N_Vector Z,sunindextype local_length,int myid)

{
  int iVar1;
  sunrealtype in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  N_Vector in_RDI;
  uint in_R8D;
  double dVar2;
  double dVar3;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  int fails;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  int iVar5;
  
  iVar5 = 0;
  uVar4 = 0;
  N_VConst(0x4000000000000000,in_RDI);
  N_VConst(0xbfe0000000000000,in_RSI);
  N_VConst(0,in_RDX);
  dVar2 = get_time();
  N_VProd(in_RDI,in_RSI,in_RDX);
  sync_device(in_RDI);
  dVar3 = get_time();
  iVar1 = check_ans(in_RCX,(N_Vector)CONCAT44(in_R8D,iVar5),
                    CONCAT44(uVar4,in_stack_ffffffffffffffd0));
  if (iVar1 == 0) {
    if (in_R8D == 0) {
      printf("PASSED test -- N_VProd \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VProd, Proc %d \n",(ulong)in_R8D);
    iVar5 = iVar5 + 1;
  }
  dVar2 = max_time(in_RDI,dVar3 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar2,"N_VProd");
  }
  return iVar5;
}

Assistant:

int Test_N_VProd(N_Vector X, N_Vector Y, N_Vector Z, sunindextype local_length,
                 int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;

  /* fill vector data */
  N_VConst(TWO, X);
  N_VConst(NEG_HALF, Y);
  N_VConst(ZERO, Z);

  start_time = get_time();
  N_VProd(X, Y, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z should be vector of -1 */
  failure = check_ans(NEG_ONE, Z, local_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VProd, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VProd \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VProd", maxt);

  return (fails);
}